

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::FillColumnHorizPalCommand::Execute(FillColumnHorizPalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint8_t uVar4;
  uint8_t *puStack_28;
  int x;
  uint8_t *dest;
  uint8_t color;
  int count;
  DrawerThread *thread_local;
  FillColumnHorizPalCommand *this_local;
  
  uVar4 = (uint8_t)(this->super_PalColumnHorizCommand)._color;
  uVar2 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnHorizCommand)._yl,
                     (this->super_PalColumnHorizCommand)._count);
  if (0 < (int)uVar2) {
    uVar1 = (this->super_PalColumnHorizCommand)._x;
    puStack_28 = thread->dc_temp;
    iVar3 = DrawerThread::temp_line_for_thread(thread,(this->super_PalColumnHorizCommand)._yl);
    puStack_28 = puStack_28 + (int)((uVar1 & 3) + iVar3 * 4);
    if ((uVar2 & 1) != 0) {
      *puStack_28 = uVar4;
      puStack_28 = puStack_28 + 4;
    }
    for (iVar3 = (int)uVar2 >> 1; iVar3 != 0; iVar3 = iVar3 + -1) {
      *puStack_28 = uVar4;
      puStack_28[4] = uVar4;
      puStack_28 = puStack_28 + 8;
    }
  }
  return;
}

Assistant:

void FillColumnHorizPalCommand::Execute(DrawerThread *thread)
	{
		int count = _count;
		uint8_t color = _color;
		uint8_t *dest;

		count = thread->count_for_thread(_yl, count);
		if (count <= 0)
			return;

		int x = _x & 3;
		dest = &thread->dc_temp[x + thread->temp_line_for_thread(_yl) * 4];

		if (count & 1) {
			*dest = color;
			dest += 4;
		}
		if (!(count >>= 1))
			return;
		do {
			dest[0] = color; dest[4] = color;
			dest += 8;
		} while (--count);
	}